

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O1

void __thiscall
COutPoint::
SerializationOps<ParamsStream<SpanReader&,TransactionSerParams>,COutPoint,ActionUnserialize>
          (COutPoint *this,long obj,undefined8 param_3,size_t param_4)

{
  long in_FS_OFFSET;
  uint32_t obj_1;
  uint32_t local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  SpanReader::read(*(SpanReader **)(obj + 8),(int)this,(void *)0x20,param_4);
  SpanReader::read(*(SpanReader **)(obj + 8),(int)&local_1c,(void *)0x4,param_4);
  this->n = local_1c;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(COutPoint, obj) { READWRITE(obj.hash, obj.n); }